

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O1

int yaml_document_add_scalar
              (yaml_document_t *document,yaml_char_t *tag,yaml_char_t *value,int length,
              yaml_scalar_style_t style)

{
  yaml_node_t *pyVar1;
  int iVar2;
  size_t sVar3;
  yaml_char_t *__ptr;
  yaml_char_t *__dest;
  size_t length_00;
  char *start;
  
  if (document == (yaml_document_t *)0x0) {
    __assert_fail("document",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                  ,0x4b7,
                  "int yaml_document_add_scalar(yaml_document_t *, yaml_char_t *, yaml_char_t *, int, yaml_scalar_style_t)"
                 );
  }
  if (value == (yaml_char_t *)0x0) {
    __assert_fail("value",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                  ,0x4b8,
                  "int yaml_document_add_scalar(yaml_document_t *, yaml_char_t *, yaml_char_t *, int, yaml_scalar_style_t)"
                 );
  }
  start = "tag:yaml.org,2002:str";
  if (tag != (yaml_char_t *)0x0) {
    start = (char *)tag;
  }
  sVar3 = strlen(start);
  iVar2 = yaml_check_utf8((yaml_char_t *)start,sVar3);
  if ((iVar2 == 0) || (__ptr = (yaml_char_t *)strdup(start), __ptr == (yaml_char_t *)0x0)) {
    __ptr = (yaml_char_t *)0x0;
  }
  else {
    if (length < 0) {
      sVar3 = strlen((char *)value);
      length = (int)sVar3;
    }
    length_00 = (size_t)length;
    iVar2 = yaml_check_utf8(value,length_00);
    if ((iVar2 != 0) &&
       (__dest = (yaml_char_t *)malloc((long)(int)(length + 1 + (uint)(length == -1))),
       __dest != (yaml_char_t *)0x0)) {
      memcpy(__dest,value,length_00);
      __dest[length_00] = '\0';
      if (((document->nodes).top != (document->nodes).end) ||
         (iVar2 = yaml_stack_extend((void **)document,&(document->nodes).top,&(document->nodes).end)
         , iVar2 != 0)) {
        pyVar1 = (document->nodes).top;
        (document->nodes).top = pyVar1 + 1;
        *(undefined8 *)pyVar1 = 1;
        pyVar1->tag = __ptr;
        (pyVar1->data).scalar.value = __dest;
        (pyVar1->data).scalar.length = length_00;
        (pyVar1->data).scalar.style = style;
        *(undefined8 *)((long)&(pyVar1->data).sequence.items.top + 4) = 0;
        *(undefined8 *)((long)&pyVar1->data + 0x1c) = 0;
        *(undefined8 *)((long)&(pyVar1->start_mark).index + 4) = 0;
        *(undefined8 *)((long)&(pyVar1->start_mark).line + 4) = 0;
        *(undefined8 *)((long)&(pyVar1->start_mark).column + 4) = 0;
        *(undefined8 *)((long)&(pyVar1->end_mark).index + 4) = 0;
        (pyVar1->end_mark).line = 0;
        (pyVar1->end_mark).column = 0;
        return (int)((ulong)((long)(document->nodes).top - (long)(document->nodes).start) >> 5) *
               -0x55555555;
      }
      goto LAB_001aea87;
    }
  }
  __dest = (yaml_char_t *)0x0;
LAB_001aea87:
  if (__ptr != (yaml_char_t *)0x0) {
    free(__ptr);
  }
  if (__dest != (yaml_char_t *)0x0) {
    free(__dest);
  }
  return 0;
}

Assistant:

YAML_DECLARE(int)
yaml_document_add_scalar(yaml_document_t *document,
        yaml_char_t *tag, yaml_char_t *value, int length,
        yaml_scalar_style_t style)
{
    struct {
        yaml_error_type_t error;
    } context;
    yaml_mark_t mark = { 0, 0, 0 };
    yaml_char_t *tag_copy = NULL;
    yaml_char_t *value_copy = NULL;
    yaml_node_t node;

    assert(document);   /* Non-NULL document object is expected. */
    assert(value);      /* Non-NULL value is expected. */

    if (!tag) {
        tag = (yaml_char_t *)YAML_DEFAULT_SCALAR_TAG;
    }

    if (!yaml_check_utf8(tag, strlen((char *)tag))) goto error;
    tag_copy = yaml_strdup(tag);
    if (!tag_copy) goto error;

    if (length < 0) {
        length = strlen((char *)value);
    }

    if (!yaml_check_utf8(value, length)) goto error;
    value_copy = YAML_MALLOC(length+1);
    if (!value_copy) goto error;
    memcpy(value_copy, value, length);
    value_copy[length] = '\0';

    SCALAR_NODE_INIT(node, tag_copy, value_copy, length, style, mark, mark);
    if (!PUSH(&context, document->nodes, node)) goto error;

    return document->nodes.top - document->nodes.start;

error:
    yaml_free(tag_copy);
    yaml_free(value_copy);

    return 0;
}